

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::Filter::setOperator(Filter *this,shared_ptr<helics::FilterOperator> *filterOp)

{
  long in_RDI;
  shared_ptr<helics::FilterOperator> *__r;
  shared_ptr<helics::FilterOperator> *this_00;
  shared_ptr<helics::FilterOperator> local_28;
  undefined4 local_14;
  
  __r = *(shared_ptr<helics::FilterOperator> **)(in_RDI + 8);
  local_14 = *(undefined4 *)(in_RDI + 0x10);
  this_00 = &local_28;
  std::shared_ptr<helics::FilterOperator>::shared_ptr(this_00,__r);
  (*(code *)(__r->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            [0x54]._vptr_FilterOperator)(__r,local_14,this_00);
  std::shared_ptr<helics::FilterOperator>::~shared_ptr
            ((shared_ptr<helics::FilterOperator> *)0x39c906);
  return;
}

Assistant:

void Filter::setOperator(std::shared_ptr<FilterOperator> filterOp)
{
    mCore->setFilterOperator(handle, std::move(filterOp));
}